

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

void __thiscall QAccessibleTable::QAccessibleTable(QAccessibleTable *this,QWidget *w)

{
  QTableView *pQVar1;
  QTreeView *pQVar2;
  QListView *pQVar3;
  QObject *in_RSI;
  QAccessibleTableInterface *in_RDI;
  
  QAccessibleTableInterface::QAccessibleTableInterface(in_RDI);
  QAccessibleSelectionInterface::QAccessibleSelectionInterface
            ((QAccessibleSelectionInterface *)(in_RDI + 8));
  QAccessibleObject::QAccessibleObject((QAccessibleObject *)(in_RDI + 0x10),in_RSI);
  *(undefined ***)in_RDI = &PTR__QAccessibleTable_00d2b170;
  *(undefined ***)(in_RDI + 8) = &PTR__QAccessibleTable_00d2b2c8;
  *(undefined ***)(in_RDI + 0x10) = &PTR__QAccessibleTable_00d2b328;
  QHash<int,_unsigned_int>::QHash((QHash<int,_unsigned_int> *)(in_RDI + 0x20));
  view((QAccessibleTable *)0x7f2ca5);
  pQVar1 = qobject_cast<QTableView_const*>((QObject *)0x7f2cad);
  if (pQVar1 == (QTableView *)0x0) {
    view((QAccessibleTable *)0x7f2cc9);
    pQVar2 = qobject_cast<QTreeView_const*>((QObject *)0x7f2cd1);
    if (pQVar2 == (QTreeView *)0x0) {
      view((QAccessibleTable *)0x7f2ced);
      pQVar3 = qobject_cast<QListView_const*>((QObject *)0x7f2cf5);
      if (pQVar3 == (QListView *)0x0) {
        *(undefined4 *)(in_RDI + 0x28) = 0x18;
      }
      else {
        *(undefined4 *)(in_RDI + 0x28) = 0x21;
      }
    }
    else {
      *(undefined4 *)(in_RDI + 0x28) = 0x23;
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0x28) = 0x18;
  }
  return;
}

Assistant:

QAccessibleTable::QAccessibleTable(QWidget *w)
    : QAccessibleObject(w)
{
    Q_ASSERT(view());

#if QT_CONFIG(tableview)
    if (qobject_cast<const QTableView*>(view())) {
        m_role = QAccessible::Table;
    } else
#endif
#if QT_CONFIG(treeview)
    if (qobject_cast<const QTreeView*>(view())) {
        m_role = QAccessible::Tree;
    } else
#endif
#if QT_CONFIG(listview)
    if (qobject_cast<const QListView*>(view())) {
        m_role = QAccessible::List;
    } else
#endif
    {
        // is this our best guess?
        m_role = QAccessible::Table;
    }
}